

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

bool CompareObject_String(PCASC_MAP pMap,char *szExistingString,char *szString,char *szStringEnd)

{
  while ((szExistingString < szString &&
         (AsciiToUpperTable_BkSlash[(char)pMap->TableSize] ==
          AsciiToUpperTable_BkSlash[*szExistingString]))) {
    pMap = (PCASC_MAP)((long)&pMap->TableSize + 1);
    szExistingString = szExistingString + 1;
  }
  return szString <= szExistingString;
}

Assistant:

static bool CompareObject_String(
    PCASC_MAP pMap,
    const char * szExistingString,
    const char * szString,
    const char * szStringEnd)
{
    // Keep compiler happy
    CASCLIB_UNUSED(pMap);

    // Compare the whole part, case insensitive
    while(szString < szStringEnd)
    {
        if(AsciiToUpperTable_BkSlash[*szExistingString] != AsciiToUpperTable_BkSlash[*szString])
            return false;

        szExistingString++;
        szString++;
    }

    return true;
}